

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O3

vec4 __thiscall vera::Triangle::getColor(Triangle *this,vec3 *_barycenter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  Material *pMVar18;
  pointer pvVar19;
  pointer pvVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float __x;
  vec4 vVar26;
  string local_68;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_48;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_44;
  vec2 local_30;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar24;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar25;
  
  pMVar18 = this->material;
  if (pMVar18 != (Material *)0x0) {
    paVar1 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"diffuse","");
    bVar21 = Material::haveProperty(pMVar18,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (bVar21) {
      pMVar18 = this->material;
      if ((this->m_texCoords).
          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->m_texCoords).
          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"diffuse","");
        vVar26 = Material::getColor(pMVar18,&local_68);
        aVar24 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)vVar26.field_2;
        aVar25 = vVar26.field_3;
        local_48 = vVar26.field_0;
        aStack_44 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)vVar26.field_1;
      }
      else {
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"diffuse","");
        pvVar19 = (this->m_texCoords).
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = _barycenter->field_0;
        uVar10 = _barycenter->field_1;
        fVar22 = (_barycenter->field_2).z * pvVar19[2].field_0.x +
                 (pvVar19->field_0).x * (float)uVar2 +
                 (float)((ulong)*(undefined8 *)&pvVar19->field_1 >> 0x20) * (float)uVar10;
        __x = (_barycenter->field_2).z * pvVar19[2].field_1.y +
              pvVar19[1].field_1.y * (float)uVar10 +
              (float)*(undefined8 *)&pvVar19->field_1 * (float)uVar2;
        local_48.x = floorf(fVar22);
        fVar23 = floorf(__x);
        local_30.field_1.y = __x - fVar23;
        local_30.field_0.x = fVar22 - local_48.x;
        vVar26 = Material::getColor(pMVar18,&local_68,&local_30);
        aVar24 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)vVar26.field_2;
        aVar25 = vVar26.field_3;
        local_48 = vVar26.field_0;
        aStack_44 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)vVar26.field_1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      goto LAB_00242e74;
    }
  }
  pvVar20 = (this->m_colors).
            super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar20 ==
      (this->m_colors).
      super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_48.x = 1.0;
    aStack_44.w = 1.0;
    aVar24.x = local_48.x;
    aVar25.w = aStack_44.w;
  }
  else {
    uVar3 = pvVar20->field_0;
    uVar11 = pvVar20->field_1;
    uVar4 = pvVar20->field_2;
    uVar12 = pvVar20->field_3;
    uVar5 = pvVar20[1].field_0;
    uVar13 = pvVar20[1].field_1;
    uVar6 = pvVar20[1].field_2;
    uVar14 = pvVar20[1].field_3;
    uVar7 = pvVar20[2].field_0;
    uVar15 = pvVar20[2].field_1;
    uVar8 = pvVar20[2].field_2;
    uVar16 = pvVar20[2].field_3;
    uVar9 = _barycenter->field_1;
    uVar17 = _barycenter->field_2;
    fVar22 = (_barycenter->field_0).x;
    local_48.x = (float)uVar7 * (float)uVar17 + (float)uVar9 * (float)uVar5 + (float)uVar3 * fVar22;
    aStack_44.w = (float)uVar15 * (float)uVar17 +
                  (float)uVar13 * (float)uVar9 + (float)uVar11 * fVar22;
    aVar24.x = (float)uVar17 * (float)uVar8 + (float)uVar9 * (float)uVar6 + fVar22 * (float)uVar4;
    aVar25.w = (float)uVar16 * (float)uVar17 + (float)uVar14 * (float)uVar9 + fVar22 * (float)uVar12
    ;
  }
LAB_00242e74:
  vVar26.field_1.y = aStack_44.w;
  vVar26.field_0 = local_48;
  vVar26.field_3 = aVar25;
  vVar26.field_2.z = aVar24.x;
  return vVar26;
}

Assistant:

glm::vec4 Triangle::getColor(const glm::vec3& _barycenter) const {
    if (material != nullptr) {
        if ( material->haveProperty("diffuse") ) {
            if (haveTexCoords())
                return material->getColor("diffuse", glm::fract( getTexCoord(_barycenter) ) );
            else
                return material->getColor("diffuse");
        }
    }

    if (haveColors())
        return  getColor(0) * _barycenter.x +
                getColor(1) * _barycenter.y +
                getColor(2) * _barycenter.z;
    else
        return glm::vec4(1.0f);
}